

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

Stream * rw::d3d8::readNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  FILE *pFVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  char *pcVar5;
  undefined4 *puVar6;
  undefined2 *puVar7;
  void *pvVar8;
  uint16 *puVar9;
  uint8 *puVar10;
  uint8 *verts;
  uint16 *indices;
  uint32 i_1;
  uint32 matid;
  uint32 i;
  InstanceData *inst;
  uint8 *p;
  uint8 *data;
  int32 size;
  InstanceDataHeader *header;
  undefined4 local_48;
  Error _e_1;
  Error _e;
  uint32 platform;
  Geometry *geometry;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    uVar3 = Stream::readU32(stream);
    if (uVar3 == 8) {
      puVar6 = (undefined4 *)
               mustmalloc_LOC(0x10,0x3000f,
                              "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 116"
                             );
      *(undefined4 **)((long)object + 0x98) = puVar6;
      *puVar6 = 8;
      uVar4 = Stream::readI32(stream);
      puVar7 = (undefined2 *)
               mustmalloc_LOC((long)(int)uVar4,0x1000f,
                              "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 121"
                             );
      (*stream->_vptr_Stream[4])(stream,puVar7,(ulong)uVar4);
      *(undefined2 *)(puVar6 + 1) = *puVar7;
      *(undefined2 *)((long)puVar6 + 6) = puVar7[1];
      inst = (InstanceData *)(puVar7 + 2);
      pvVar8 = mustmalloc_LOC((ulong)*(ushort *)((long)puVar6 + 6) * 0x38,0x3000f,
                              "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 126"
                             );
      *(void **)(puVar6 + 2) = pvVar8;
      _matid = *(uint32 **)(puVar6 + 2);
      for (i_1 = 0; i_1 < *(ushort *)((long)puVar6 + 6); i_1 = i_1 + 1) {
        *_matid = inst->minVert;
        _matid[1] = inst->stride;
        _matid[2] = inst->numVertices;
        _matid[3] = inst->numIndices;
        *(undefined8 *)(_matid + 4) =
             *(undefined8 *)(*(long *)((long)object + 0x80) + (ulong)*(uint *)&inst->material * 8);
        _matid[6] = *(uint32 *)((long)&inst->material + 4);
        _matid[7] = inst->vertexShader;
        _matid[8] = 0;
        _matid[9] = 0;
        _matid[10] = 0;
        _matid[0xb] = 0;
        _matid[0xc] = 0;
        *(undefined1 *)(_matid + 0xd) = *(undefined1 *)&inst->vertexBuffer;
        *(undefined1 *)((long)_matid + 0x35) = 0;
        *(undefined1 *)((long)_matid + 0x36) = 0;
        inst = (InstanceData *)((long)&inst->vertexBuffer + 3);
        _matid = _matid + 0xe;
      }
      (*DAT_00168638)(puVar7);
      _matid = *(uint32 **)(puVar6 + 2);
      for (indices._4_4_ = 0; stream_local = stream, indices._4_4_ < *(ushort *)((long)puVar6 + 6);
          indices._4_4_ = indices._4_4_ + 1) {
        pvVar8 = d3d::createIndexBuffer(*(int *)((long)_matid + 0xc) << 1,false);
        *(void **)((long)_matid + 0x20) = pvVar8;
        puVar9 = d3d::lockIndices(*(void **)((long)_matid + 0x20),0,0,0);
        (*stream->_vptr_Stream[4])(stream,puVar9,(ulong)(uint)(*(int *)((long)_matid + 0xc) << 1));
        d3d::unlockIndices(*(void **)((long)_matid + 0x20));
        *(undefined1 *)((long)_matid + 0x35) = 1;
        pvVar8 = d3d::createVertexBuffer
                           (*(int *)((long)_matid + 4) * *(int *)((long)_matid + 8),0,false);
        *(void **)((long)_matid + 0x28) = pvVar8;
        puVar10 = d3d::lockVertices(*(void **)((long)_matid + 0x28),0,0,0);
        (*stream->_vptr_Stream[4])
                  (stream,puVar10,
                   (ulong)(uint)(*(int *)((long)_matid + 4) * *(int *)((long)_matid + 8)));
        d3d::unlockVertices(*(void **)((long)_matid + 0x28));
        _matid = (uint32 *)((long)_matid + 0x38);
      }
    }
    else {
      header._4_4_ = 2;
      local_48 = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp"
              ,0x71);
      pFVar1 = _stderr;
      pcVar5 = dbgsprint(0x80000006,(ulong)uVar3);
      fprintf(pFVar1,"%s\n",pcVar5);
      setError((Error *)((long)&header + 4));
      stream_local = (Stream *)0x0;
    }
  }
  else {
    _e_1.plugin = 2;
    _e_1.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp"
            ,0x6c);
    pFVar1 = _stderr;
    pcVar5 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar5);
    setError(&_e_1);
    stream_local = (Stream *)0x0;
  }
  return stream_local;
}

Assistant:

Stream*
readNativeData(Stream *stream, int32, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_D3D8){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geometry->instData = header;
	header->platform = PLATFORM_D3D8;

	int32 size = stream->readI32();
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->read8(data, size);
	uint8 *p = data;
	header->serialNumber = *(uint16*)p; p += 2;
	header->numMeshes = *(uint16*)p; p += 2;
	header->inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		inst->minVert = *(uint32*)p; p += 4;
		inst->stride = *(uint32*)p; p += 4;
		inst->numVertices = *(uint32*)p; p += 4;
		inst->numIndices = *(uint32*)p; p += 4;
		uint32 matid = *(uint32*)p; p += 4;
		inst->material = geometry->matList.materials[matid];
		inst->vertexShader = *(uint32*)p; p += 4;
		inst->primType = *(uint32*)p; p += 4;
		inst->indexBuffer = nil; p += 4;
		inst->vertexBuffer = nil; p += 4;
		inst->baseIndex = 0; p += 4;
		inst->vertexAlpha = *p++;
		inst->managed = 0; p++;
		inst->remapped = 0; p++;	// TODO: really unused? and what's that anyway?
		inst++;
	}
	rwFree(data);

	inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		assert(inst->indexBuffer == nil);
		inst->indexBuffer = createIndexBuffer(inst->numIndices*2, false);
		uint16 *indices = lockIndices(inst->indexBuffer, 0, 0, 0);
		stream->read8(indices, 2*inst->numIndices);
		unlockIndices(inst->indexBuffer);

		inst->managed = 1;
		assert(inst->vertexBuffer == nil);
		inst->vertexBuffer = createVertexBuffer(inst->stride*inst->numVertices, 0, false);
		uint8 *verts = lockVertices(inst->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->read8(verts, inst->stride*inst->numVertices);
		unlockVertices(inst->vertexBuffer);

		inst++;
	}
	return stream;
}